

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif.cpp
# Opt level: O1

AspifOutput * __thiscall Potassco::AspifOutput::add(AspifOutput *this,WeightLitSpan *lits)

{
  ostream *poVar1;
  WeightLit_t *pWVar2;
  
  poVar1 = this->os_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  if (lits->size != 0) {
    pWVar2 = lits->first;
    do {
      poVar1 = this->os_;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,pWVar2->lit);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      std::ostream::operator<<((ostream *)poVar1,pWVar2->weight);
      pWVar2 = pWVar2 + 1;
    } while (pWVar2 != lits->first + lits->size);
  }
  return this;
}

Assistant:

AspifOutput& AspifOutput::add(const WeightLitSpan& lits) {
	os_ << " " << size(lits);
	for (const WeightLit_t* x = begin(lits); x != end(lits); ++x) {
		os_ << " " << lit(*x) << " " << weight(*x);
	}
	return *this;
}